

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall
cmCTest::RunCommand(cmCTest *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,string *stdOut,string *stdErr,int *retVal,char *dir,cmDuration timeout,
                   Encoding encoding)

{
  pointer pbVar1;
  string *psVar2;
  uint uVar3;
  int iVar4;
  cmsysProcess *cp;
  pointer pcVar5;
  char *pcVar6;
  bool bVar7;
  ulong uVar8;
  size_t sVar9;
  string *a;
  pointer pbVar10;
  bool bVar11;
  cmProcessOutput processOutput;
  int length;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  char *data;
  string strdata;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_2d8 [3];
  cmProcessOutput local_2d5;
  int local_2d4;
  cmCTest *local_2d0;
  vector<char,_std::allocator<char>_> local_2c8;
  vector<char,_std::allocator<char>_> local_2a8;
  long *local_288;
  long local_278 [2];
  string *local_268;
  char *local_260;
  vector<char,_std::allocator<char>_> local_258;
  vector<char,_std::allocator<char>_> local_238;
  int *local_218;
  string *local_210;
  string local_208;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d0 = this;
  local_268 = (string *)timeout.__r;
  local_218 = retVal;
  local_210 = stdOut;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&local_1e8,
             ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != pbVar1) {
    do {
      local_1a8._0_8_ = (pbVar10->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_1e8,(char **)local_1a8);
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar1);
  }
  local_1a8._0_8_ = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1e8,(char **)local_1a8);
  local_210->_M_string_length = 0;
  *(local_210->_M_dataplus)._M_p = '\0';
  stdErr->_M_string_length = 0;
  *(stdErr->_M_dataplus)._M_p = '\0';
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  cmsysProcess_SetTimeout(cp,(double)local_268);
  cmsysProcess_Execute(cp);
  local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_268 = stdErr;
  cmProcessOutput::cmProcessOutput(&local_2d5,encoding,0x400);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  bVar11 = false;
  do {
    uVar3 = cmsysProcess_WaitForData(cp,&local_260,&local_2d4,(double *)0x0);
    if (uVar3 == 2) {
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)&local_2a8);
      bVar7 = bVar11;
    }
    else {
      bVar7 = true;
      if (uVar3 == 3) {
        std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                  ((vector<char,std::allocator<char>> *)&local_2c8);
        bVar7 = bVar11;
      }
    }
    if (((uVar3 & 0xfffffffe) == 2) && (local_2d0->ExtraVerbose == true)) {
      cmProcessOutput::DecodeText(&local_2d5,local_260,(long)local_2d4,&local_208,0);
      cmSystemTools::Stdout(&local_208);
    }
    psVar2 = local_268;
    bVar11 = bVar7;
  } while (!bVar7);
  if (local_2d0->ExtraVerbose == true) {
    local_1c8._M_string_length = 0;
    local_1c8.field_2._M_local_buf[0] = '\0';
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    cmProcessOutput::DecodeText(&local_2d5,&local_1c8,&local_208,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    if (local_208._M_string_length != 0) {
      cmSystemTools::Stdout(&local_208);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if (local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar8 = (long)local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((long)uVar8 < 0) goto LAB_00158ae4;
    pcVar5 = (pointer)operator_new(uVar8);
    local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar5 + uVar8;
    sVar9 = (long)local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar5;
    if (sVar9 != 0) {
      local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar5;
      memmove(pcVar5,local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar9);
    }
    local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar5 + sVar9;
    cmProcessOutput::DecodeText(&local_2d5,&local_238,&local_2a8,0);
    if (local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__cxx11::string::append
              ((char *)local_210,
               (ulong)local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  if (local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar8 = (long)local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((long)uVar8 < 0) {
LAB_00158ae4:
      std::__throw_bad_alloc();
    }
    pcVar5 = (pointer)operator_new(uVar8);
    local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar5 + uVar8;
    sVar9 = (long)local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar5;
    if (sVar9 != 0) {
      local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar5;
      memmove(pcVar5,local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar9);
    }
    local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar5 + sVar9;
    cmProcessOutput::DecodeText(&local_2d5,&local_258,&local_2c8,0);
    if (local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__cxx11::string::append
              ((char *)psVar2,
               (ulong)local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  iVar4 = cmsysProcess_GetState(cp);
  if (iVar4 == 4) {
    if (local_218 == (int *)0x0) {
      iVar4 = cmsysProcess_GetExitValue(cp);
      bVar11 = iVar4 == 0;
    }
    else {
      iVar4 = cmsysProcess_GetExitValue(cp);
      *local_218 = iVar4;
      bVar11 = true;
    }
  }
  else {
    iVar4 = cmsysProcess_GetState(cp);
    if (iVar4 == 2) {
      pcVar6 = cmsysProcess_GetExceptionString(cp);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)auStack_2d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x130);
      }
      else {
        sVar9 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar9);
      }
      std::ios::widen((char)(ostringstream *)local_1a8 +
                      (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(local_2d0,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
          0xb19,(char *)local_288,false);
      if (local_288 != local_278) {
        operator_delete(local_288,local_278[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      strlen(pcVar6);
      std::__cxx11::string::append((char *)psVar2,(ulong)pcVar6);
    }
    else {
      iVar4 = cmsysProcess_GetState(cp);
      if (iVar4 == 1) {
        pcVar6 = cmsysProcess_GetErrorString(cp);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)auStack_2d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x130);
        }
        else {
          sVar9 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar9);
        }
        std::ios::widen((char)(ostringstream *)local_1a8 +
                        (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
        std::ostream::put((char)local_1a8);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_2d0,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx"
            ,0xb1e,(char *)local_288,false);
        if (local_288 != local_278) {
          operator_delete(local_288,local_278[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        strlen(pcVar6);
        std::__cxx11::string::append((char *)psVar2,(ulong)pcVar6);
      }
      else {
        iVar4 = cmsysProcess_GetState(cp);
        bVar11 = true;
        if (iVar4 != 5) goto LAB_00158a4e;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Process terminated due to timeout\n",0x22);
        std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_1a8);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_2d0,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx"
            ,0xb23,(char *)local_288,false);
        if (local_288 != local_278) {
          operator_delete(local_288,local_278[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        std::__cxx11::string::append((char *)psVar2,0x534a46);
      }
    }
    bVar11 = false;
  }
LAB_00158a4e:
  cmsysProcess_Delete(cp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_2d5);
  if (local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar11;
}

Assistant:

bool cmCTest::RunCommand(std::vector<std::string> const& args,
                         std::string* stdOut, std::string* stdErr, int* retVal,
                         const char* dir, cmDuration timeout,
                         Encoding encoding)
{
  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& a : args) {
    argv.push_back(a.c_str());
  }
  argv.push_back(nullptr);

  stdOut->clear();
  stdErr->clear();

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }
  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  std::vector<char> tempOutput;
  std::vector<char> tempError;
  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  int res;
  bool done = false;
  while (!done) {
    res = cmsysProcess_WaitForData(cp, &data, &length, nullptr);
    switch (res) {
      case cmsysProcess_Pipe_STDOUT:
        tempOutput.insert(tempOutput.end(), data, data + length);
        break;
      case cmsysProcess_Pipe_STDERR:
        tempError.insert(tempError.end(), data, data + length);
        break;
      default:
        done = true;
    }
    if ((res == cmsysProcess_Pipe_STDOUT || res == cmsysProcess_Pipe_STDERR) &&
        this->ExtraVerbose) {
      processOutput.DecodeText(data, length, strdata);
      cmSystemTools::Stdout(strdata);
    }
  }
  if (this->ExtraVerbose) {
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);
  if (!tempOutput.empty()) {
    processOutput.DecodeText(tempOutput, tempOutput);
    stdOut->append(tempOutput.data(), tempOutput.size());
  }
  if (!tempError.empty()) {
    processOutput.DecodeText(tempError, tempError);
    stdErr->append(tempError.data(), tempError.size());
  }

  bool result = true;
  if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
    } else {
      if (cmsysProcess_GetExitValue(cp) != 0) {
        result = false;
      }
    }
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exception) {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    cmCTestLog(this, ERROR_MESSAGE, exception_str << std::endl);
    stdErr->append(exception_str, strlen(exception_str));
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Error) {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    cmCTestLog(this, ERROR_MESSAGE, error_str << std::endl);
    stdErr->append(error_str, strlen(error_str));
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Expired) {
    const char* error_str = "Process terminated due to timeout\n";
    cmCTestLog(this, ERROR_MESSAGE, error_str << std::endl);
    stdErr->append(error_str, strlen(error_str));
    result = false;
  }

  cmsysProcess_Delete(cp);
  return result;
}